

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

bool __thiscall
ContextSpecificHolder<Extensions,_(unsigned_char)'\xa0',_(OptionType)1>::Decode
          (ContextSpecificHolder<Extensions,_(unsigned_char)__xa0_,_(OptionType)1> *this,uchar *pIn,
          size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  out_of_range *this_00;
  size_t local_38;
  size_t size;
  
  if (cbIn == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"Insufficient buffer");
LAB_00124580:
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if (*pIn != 0xa0) goto LAB_0012451f;
  local_38 = 0;
  size = 0;
  if (cbIn < 3) {
    if ((cbIn == 2) && (pIn[1] == '\0')) {
      local_38 = 2;
      sVar3 = 2;
      goto LAB_001244d2;
    }
    bVar2 = false;
    *cbUsed = 0;
LAB_00124515:
    bVar1 = false;
  }
  else {
    bVar2 = DecodeSize(pIn + 1,cbIn - 1,&local_38,&size);
    if ((!bVar2) || (sVar3 = size + 1, cbIn < local_38 + sVar3)) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Illegal size value");
      goto LAB_00124580;
    }
LAB_001244d2:
    size = sVar3;
    bVar2 = Extensions::Decode(&this->innerType,pIn + sVar3,local_38,cbUsed);
    if (bVar2) {
      *cbUsed = *cbUsed + size;
      this->hasData = true;
      bVar2 = true;
      goto LAB_00124515;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return bVar2;
  }
LAB_0012451f:
  *cbUsed = 0;
  return false;
}

Assistant:

bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
	{
        // If this is an optional type, we could have used
        // all the bytes on the previous item
        if (cbIn == 0)
            throw std::out_of_range("Insufficient buffer");

        if (pIn[0] == type)
        {
            size_t offset = 0;

            // Validate the sequence
            size_t size = 0;
            size_t cbPrefix = 0;

            if (!CheckDecode(pIn, cbIn, static_cast<const DerType>(*pIn), size, cbPrefix))
            {
                cbUsed = 0;
                return false;
            }

            offset += cbPrefix;
            // Now, we can decode the inner type
            if (innerType.Decode(pIn + offset, size, cbUsed))
            {
                cbUsed += cbPrefix;
                hasData = true;
                return true;
            }
        }

        cbUsed = 0;
        return false;
	}